

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O0

void __thiscall soplex::SPxFastRT<double>::tighten(SPxFastRT<double> *this)

{
  double dVar1;
  element_type *peVar2;
  long in_RDI;
  Real RVar3;
  Real RVar4;
  double delta_shift;
  SPxRatioTester<double> *in_stack_ffffffffffffff58;
  SPxRatioTester<double> *this_00;
  
  SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff58);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2f2a76);
  RVar3 = Tolerances::scaleAccordingToEpsilon(peVar2,1e-05);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f2a99);
  if (*(double *)(in_RDI + 0x20) + RVar3 <= *(double *)(in_RDI + 0x48)) {
    *(double *)(in_RDI + 0x48) = *(double *)(in_RDI + 0x48) - RVar3;
    dVar1 = *(double *)(in_RDI + 0x48);
    SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff58);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f2b05);
    RVar4 = Tolerances::scaleAccordingToEpsilon(peVar2,0.0001);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f2b25);
    if (RVar4 < dVar1) {
      *(double *)(in_RDI + 0x48) = *(double *)(in_RDI + 0x48) - RVar3 * 2.0;
    }
  }
  dVar1 = *(double *)(in_RDI + 0x38);
  SPxRatioTester<double>::tolerances(in_stack_ffffffffffffff58);
  peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2f2b81);
  RVar3 = Tolerances::scaleAccordingToEpsilon(peVar2,1e-05);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f2ba1);
  if (dVar1 < RVar3) {
    *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) / 0.9;
    this_00 = *(SPxRatioTester<double> **)(in_RDI + 0x38);
    SPxRatioTester<double>::tolerances(this_00);
    peVar2 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2f2bf5);
    RVar3 = Tolerances::floatingPointFeastol(peVar2);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2f2c0f);
    if ((double)this_00 < RVar3) {
      *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) / 0.9;
    }
  }
  return;
}

Assistant:

void SPxFastRT<R>::tighten()
{
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);

   if(fastDelta >= this->delta + delta_shift)
   {
      fastDelta -= delta_shift;

      if(fastDelta > this->tolerances()->scaleAccordingToEpsilon(1e-4))
         fastDelta -= 2 * delta_shift;
   }

   if(minStab < this->tolerances()->scaleAccordingToEpsilon(SOPLEX_MINSTAB))
   {
      minStab /= 0.90;

      if(minStab < this->tolerances()->floatingPointFeastol())
         minStab /= 0.90;
   }
}